

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseVASection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte bVar1;
  void *pvVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  byte *__s2;
  SMDImporter *this_00;
  int iTime;
  byte *apbStack_120 [2];
  ulong local_110;
  vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_> *local_108;
  char **local_100;
  Face local_f8;
  
  local_108 = &this->asTriangles;
  apbStack_120[1] = (byte *)szCurrent;
  local_110 = 0;
  local_100 = szCurrentOut;
LAB_005ea069:
  do {
    this->iLineNumber = this->iLineNumber + 1;
    __s2 = apbStack_120[1];
    while (((ulong)*__s2 < 0x21 && ((0x100002600U >> ((ulong)*__s2 & 0x3f) & 1) != 0))) {
      __s2 = __s2 + 1;
    }
    apbStack_120[1] = __s2;
    if (*__s2 == 0) goto LAB_005ea237;
    apbStack_120[0] = (byte *)0x5ea0a9;
    iVar6 = strncmp("end",(char *)__s2,3);
    pbVar4 = apbStack_120[1];
    if (iVar6 == 0) {
      bVar1 = __s2[3];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        apbStack_120[1] = __s2 + (4 - (ulong)(bVar1 == 0));
LAB_005ea237:
        if (((int)local_110 != 2) &&
           ((this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          apbStack_120[0] = (byte *)0x5ea258;
          std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::pop_back(local_108);
        }
        this->iLineNumber = this->iLineNumber + 1;
        while (((ulong)*apbStack_120[1] < 0x21 &&
               ((0x100002600U >> ((ulong)*apbStack_120[1] & 0x3f) & 1) != 0))) {
          apbStack_120[1] = apbStack_120[1] + 1;
        }
        *local_100 = (char *)apbStack_120[1];
        return;
      }
    }
    this_00 = (SMDImporter *)0x7786ba;
    apbStack_120[0] = (byte *)0x5ea0d9;
    iVar6 = strncmp("time",(char *)apbStack_120[1],4);
    if (iVar6 == 0) {
      bVar1 = pbVar4[4];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        apbStack_120[1] = pbVar4 + 5;
        if (bVar1 == 0) {
          apbStack_120[1] = pbVar4 + 4;
        }
        local_f8.iTexture = 0;
        apbStack_120[0] = (byte *)0x5ea11b;
        bVar5 = ParseSignedInt(this_00,(char *)apbStack_120[1],(char **)(apbStack_120 + 1),
                               (int *)&local_f8);
        if ((!bVar5) || (this->configFrameID != local_f8.iTexture)) goto LAB_005ea237;
        while ((0xd < *apbStack_120[1] || ((0x2401U >> (*apbStack_120[1] & 0x1f) & 1) == 0))) {
          apbStack_120[1] = apbStack_120[1] + 1;
        }
        for (; (*apbStack_120[1] == 0xd || (*apbStack_120[1] == 10));
            apbStack_120[1] = apbStack_120[1] + 1) {
        }
        this->iLineNumber = this->iLineNumber + 1;
        goto LAB_005ea069;
      }
    }
    iVar6 = (int)local_110;
    if (iVar6 == 0) {
      local_f8.iTexture = 0;
      lVar7 = 0x30;
      do {
        *(undefined8 *)((long)&local_110 + lVar7) = 0;
        *(undefined8 *)((long)&local_108 + lVar7) = 0;
        *(undefined8 *)((long)apbStack_120 + lVar7) = 0;
        *(undefined8 *)((long)apbStack_120 + lVar7 + 8) = 0;
        *(undefined8 *)((long)local_f8.avVertices + lVar7 + -0x10) = 0xffffffff00000000;
        *(undefined8 *)((long)local_f8.avVertices + lVar7 + -8) = 0;
        *(undefined8 *)((long)&local_f8.avVertices[0].pos.x + lVar7) = 0;
        *(undefined8 *)((long)&local_f8.avVertices[0].pos.z + lVar7) = 0;
        lVar7 = lVar7 + 0x40;
      } while (lVar7 != 0xf0);
      apbStack_120[0] = (byte *)0x5ea1c3;
      std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::
      emplace_back<Assimp::SMD::Face>(local_108,&local_f8);
      lVar7 = 0xc0;
      do {
        pvVar2 = *(void **)((long)&local_108 + lVar7);
        if (pvVar2 != (void *)0x0) {
          apbStack_120[0] = (byte *)0x5ea1df;
          operator_delete(pvVar2,*(long *)((long)local_f8.avVertices + lVar7 + -8) - (long)pvVar2);
        }
        lVar7 = lVar7 + -0x40;
      } while (lVar7 != 0);
      iVar6 = (int)local_110;
    }
    uVar3 = iVar6 + 1U;
    if (iVar6 + 1U == 3) {
      uVar3 = 0;
    }
    apbStack_120[0] = (byte *)0x5ea224;
    ParseVertex(this,(char *)apbStack_120[1],(char **)(apbStack_120 + 1),
                (Vertex *)
                ((long)(this->asTriangles).
                       super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                       _M_impl.super__Vector_impl_data._M_finish + (ulong)uVar3 * 0x40 + -0xc0),true
               );
    local_110 = (ulong)uVar3;
  } while( true );
}

Assistant:

void SMDImporter::ParseVASection(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iCurIndex = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the "vertexanimation" section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }

        // "time <n>\n"
        if (TokenMatch(szCurrent,"time",4)) {
            // NOTE: The doc says that time values COULD be negative ...
            // NOTE2: this is the shape key -> valve docs
            int iTime = 0;
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime) || configFrameID != (unsigned int)iTime) {
                break;
            }
            SkipLine(szCurrent,&szCurrent);
        } else {
            if(0 == iCurIndex) {
                asTriangles.push_back(SMD::Face());
            }
            if (++iCurIndex == 3) {
                iCurIndex = 0;
            }
            ParseVertex(szCurrent,&szCurrent,asTriangles.back().avVertices[iCurIndex],true);
        }
    }

    if (iCurIndex != 2 && !asTriangles.empty()) {
        // we want to no degenerates, so throw this triangle away
        asTriangles.pop_back();
    }

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}